

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComparatorFactory.cpp
# Opt level: O0

ComparatorDisposer *
ApprovalTests::ComparatorFactory::registerComparator
          (string *extensionWithDot,shared_ptr<ApprovalTests::ApprovalComparator> *comparator)

{
  ComparatorDisposer *in_RDI;
  shared_ptr<ApprovalTests::ApprovalComparator> *in_stack_ffffffffffffff78;
  shared_ptr<ApprovalTests::ApprovalComparator> *newComparator;
  shared_ptr<ApprovalTests::ApprovalComparator> *in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc0;
  ComparatorContainer *in_stack_ffffffffffffffc8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffd0;
  string local_28;
  
  comparators_abi_cxx11_();
  getComparatorForFileExtensionWithDot(&local_28);
  newComparator = (shared_ptr<ApprovalTests::ApprovalComparator> *)&stack0xffffffffffffffc8;
  ::std::shared_ptr<ApprovalTests::ApprovalComparator>::shared_ptr
            ((shared_ptr<ApprovalTests::ApprovalComparator> *)in_RDI,in_stack_ffffffffffffff78);
  ComparatorDisposer::ComparatorDisposer
            ((ComparatorDisposer *)in_stack_ffffffffffffffd0._M_pi,in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,newComparator);
  ::std::shared_ptr<ApprovalTests::ApprovalComparator>::~shared_ptr
            ((shared_ptr<ApprovalTests::ApprovalComparator> *)0x191ecc);
  ::std::shared_ptr<ApprovalTests::ApprovalComparator>::~shared_ptr
            ((shared_ptr<ApprovalTests::ApprovalComparator> *)0x191ed6);
  return in_RDI;
}

Assistant:

ComparatorDisposer
    ComparatorFactory::registerComparator(const std::string& extensionWithDot,
                                          std::shared_ptr<ApprovalComparator> comparator)
    {
        return ComparatorDisposer(comparators(),
                                  extensionWithDot,
                                  getComparatorForFileExtensionWithDot(extensionWithDot),
                                  comparator);
    }